

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O1

void __thiscall
rr::FragmentProcessor::executeScissorTest
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,WindowRectangle *scissorRect)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int regSampleNdx;
  ulong uVar7;
  
  iVar1 = scissorRect->left;
  iVar2 = scissorRect->bottom;
  iVar3 = scissorRect->width;
  iVar4 = scissorRect->height;
  uVar7 = 0;
  do {
    if (((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive == true) {
      iVar6 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                   (long)numSamplesPerFragment) + fragNdxOffset;
      iVar5 = inputFragments[iVar6].pixelCoord.m_data[0];
      if ((((iVar5 < iVar1) || (iVar3 + iVar1 <= iVar5)) ||
          (iVar5 = inputFragments[iVar6].pixelCoord.m_data[1], iVar5 < iVar2)) ||
         (iVar4 + iVar2 <= iVar5)) {
        ((SampleData *)&this->m_sampleRegister[0].isAlive)->isAlive = false;
      }
    }
    uVar7 = uVar7 + 1;
    this = (FragmentProcessor *)((long)this + 0x84);
  } while (uVar7 != 0x40);
  return;
}

Assistant:

void FragmentProcessor::executeScissorTest (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const WindowRectangle& scissorRect)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int fragNdx = fragNdxOffset + regSampleNdx/numSamplesPerFragment;

			if (!isInsideRect(inputFragments[fragNdx].pixelCoord, scissorRect))
				m_sampleRegister[regSampleNdx].isAlive = false;
		}
	}
}